

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateLogon(Session *this,Message *aLogon)

{
  FieldBase *field;
  SEQNUM SVar1;
  allocator<char> local_1e1;
  FieldBase local_1e0;
  STRING local_188;
  Message logon;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"A",&local_1e1);
  MsgType::MsgType((MsgType *)&local_1e0,&local_188);
  newMessage(&logon,this,(MsgType *)&local_1e0);
  FieldBase::~FieldBase(&local_1e0);
  std::__cxx11::string::~string((string *)&local_188);
  EncryptMethod::EncryptMethod((EncryptMethod *)&local_1e0,0);
  FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
  FieldBase::~FieldBase(&local_1e0);
  if ((this->m_sessionID).m_isFIXT == true) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_1e0,&this->m_senderDefaultApplVerID);
    FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
    FieldBase::~FieldBase(&local_1e0);
  }
  if ((this->m_state).m_receivedReset == true) {
    local_188._M_dataplus._M_p._0_1_ = 1;
    ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)&local_1e0,(BOOLEAN *)&local_188);
    FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
    FieldBase::~FieldBase(&local_1e0);
  }
  field = (FieldBase *)FieldMap::getField<FIX::HeartBtInt>(&aLogon->super_FieldMap);
  FieldMap::setField(&logon.super_FieldMap,field,true);
  if (this->m_sendNextExpectedMsgSeqNum == true) {
    SVar1 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
    NextExpectedMsgSeqNum::NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)&local_1e0,SVar1 + 1);
    FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
    FieldBase::~FieldBase(&local_1e0);
  }
  fill(this,&logon.m_header);
  sendRaw(this,&logon,0);
  (this->m_state).m_sentLogon = true;
  Message::~Message(&logon);
  return;
}

Assistant:

void Session::generateLogon(const Message &aLogon) {
  Message logon = newMessage(MsgType(MsgType_Logon));

  logon.setField(EncryptMethod(0));
  if (m_sessionID.isFIXT()) {
    logon.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  if (m_state.receivedReset()) {
    logon.setField(ResetSeqNumFlag(true));
  }
  logon.setField(aLogon.getField<HeartBtInt>());
  if (m_sendNextExpectedMsgSeqNum) {
    logon.setField(NextExpectedMsgSeqNum(
        getExpectedTargetNum() + 1)); // +1 because incoming Logon did not increment the target SeqNum yet
  }
  fill(logon.getHeader());
  sendRaw(logon);
  m_state.sentLogon(true);
}